

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::GLSL420Pack::BindingImageTest::verifyTexture(BindingImageTest *this,texture *texture)

{
  uint uVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> texture_data;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_28,0x600);
  Utils::texture::get(texture,0x1908,0x1401,local_28._M_impl.super__Vector_impl_data._M_start);
  uVar1 = *local_28._M_impl.super__Vector_impl_data._M_start;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_28);
  return uVar1 == 0xff00ff00;
}

Assistant:

bool BindingImageTest::verifyTexture(const Utils::texture& texture) const
{
	static const GLuint texture_data_size = m_width * m_height * m_depth;

	std::vector<glw::GLuint> texture_data;
	texture_data.resize(texture_data_size);

	texture.get(GL_RGBA, GL_UNSIGNED_BYTE, &texture_data[0]);

	GLuint color = texture_data[0];

	return (m_green_color == color);
}